

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

void Gia_MuxStructPrint_rec(Gia_Man_t *p,int iObj,int fFirst)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  
  pObj = Gia_ManObj(p,iObj);
  if ((fFirst == 0) &&
     (((p->pMuxes == (uint *)0x0 || (p->pMuxes[iObj] == 0)) || (0 < p->pRefs[iObj])))) {
    uVar1 = Gia_ObjLevelId(p,iObj);
    printf("<%02d>",(ulong)uVar1);
    return;
  }
  uVar1 = Gia_ObjFaninId2p(p,pObj);
  printf(" [(");
  if (((p->pMuxes == (uint *)0x0) || (p->pMuxes[(int)uVar1] == 0)) || (p->pRefs[(int)uVar1] != 0)) {
    printf("%d",(ulong)uVar1);
    uVar1 = Gia_ObjLevelId(p,uVar1);
    printf("<%d>",(ulong)uVar1);
  }
  else {
    Gia_MuxStructPrint_rec(p,uVar1,0);
  }
  putchar(0x29);
  iVar2 = Gia_ObjFaninC2(p,pObj);
  if (iVar2 == 0) {
    iVar2 = Gia_ObjFaninId1p(p,pObj);
    Gia_MuxStructPrint_rec(p,iVar2,0);
    putchar(0x7c);
    iVar2 = Gia_ObjFaninId0p(p,pObj);
  }
  else {
    iVar2 = Gia_ObjFaninId0p(p,pObj);
    Gia_MuxStructPrint_rec(p,iVar2,0);
    putchar(0x7c);
    iVar2 = Gia_ObjFaninId1p(p,pObj);
  }
  Gia_MuxStructPrint_rec(p,iVar2,0);
  putchar(0x5d);
  return;
}

Assistant:

void Gia_MuxStructPrint_rec( Gia_Man_t * p, int iObj, int fFirst )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    int iCtrl;
    if ( !fFirst && (!Gia_ObjIsMuxId(p, iObj) || Gia_ObjRefNumId(p, iObj) > 0) )
    {
//        printf( "%d", iObj );
        printf( "<%02d>", Gia_ObjLevelId(p, iObj) );
        return;
    }
    iCtrl = Gia_ObjFaninId2p(p, pObj);
    printf( " [(" );
    if ( Gia_ObjIsMuxId(p, iCtrl) && Gia_ObjRefNumId(p, iCtrl) == 0 )
        Gia_MuxStructPrint_rec( p, iCtrl, 0 );
    else
    {
        printf( "%d", iCtrl );
        printf( "<%d>", Gia_ObjLevelId(p, iCtrl) );
    }
    printf( ")" );
    if ( Gia_ObjFaninC2(p, pObj) )
    {
        Gia_MuxStructPrint_rec( p, Gia_ObjFaninId0p(p, pObj), 0 );
        printf( "|" );
        Gia_MuxStructPrint_rec( p, Gia_ObjFaninId1p(p, pObj), 0 );
        printf( "]" );
    }
    else
    {
        Gia_MuxStructPrint_rec( p, Gia_ObjFaninId1p(p, pObj), 0 );
        printf( "|" );
        Gia_MuxStructPrint_rec( p, Gia_ObjFaninId0p(p, pObj), 0 );
        printf( "]" );
    }
}